

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O0

int av1_find_projection(int np,int *pts1,int *pts2,BLOCK_SIZE bsize,int mvy,int mvx,
                       WarpedMotionParams *wm_params,int mi_row,int mi_col)

{
  int iVar1;
  undefined4 in_EDI;
  BLOCK_SIZE in_stack_0000005f;
  undefined4 in_stack_00000064;
  int *in_stack_00000068;
  int in_stack_00000070;
  WarpedMotionParams *in_stack_00000080;
  int in_stack_00000088;
  int in_stack_00000090;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = find_affine_int(in_stack_00000070,in_stack_00000068,
                          (int *)CONCAT44(in_stack_00000064,mi_col),in_stack_0000005f,mi_row,
                          wm_params._4_4_,in_stack_00000080,in_stack_00000088,in_stack_00000090);
  if (iVar1 == 0) {
    iVar1 = av1_get_shear_params((WarpedMotionParams *)CONCAT44(in_stack_fffffffffffffffc,in_EDI));
    if (iVar1 == 0) {
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int av1_find_projection(int np, const int *pts1, const int *pts2,
                        BLOCK_SIZE bsize, int mvy, int mvx,
                        WarpedMotionParams *wm_params, int mi_row, int mi_col) {
  assert(wm_params->wmtype == AFFINE);

  if (find_affine_int(np, pts1, pts2, bsize, mvy, mvx, wm_params, mi_row,
                      mi_col))
    return 1;

  // check compatibility with the fast warp filter
  if (!av1_get_shear_params(wm_params)) return 1;

  return 0;
}